

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Gia_ManTestDistanceInternal(Emb_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Emb_Obj_t *pEVar5;
  Emb_Obj_t *pEVar6;
  abctime aVar7;
  Gia_Obj_t *pGVar8;
  Emb_Obj_t *pNext;
  Emb_Obj_t *pPivot;
  abctime clk;
  int Dist;
  int iNode;
  int i;
  int nAttempts;
  Emb_Man_t *p_local;
  
  Gia_ManRandom(1);
  Emb_ManResetTravId(p);
  aVar4 = Abc_Clock();
  printf("From inputs: ");
  for (Dist = 0; Dist < 0x14; Dist = Dist + 1) {
    uVar1 = Gia_ManRandom(0);
    uVar2 = Emb_ManCiNum(p);
    pEVar5 = Emb_ManCi(p,uVar1 % uVar2);
    iVar3 = Emb_ObjFanoutNum(pEVar5);
    if (iVar3 == 0) {
      Dist = Dist + -1;
    }
    else {
      pEVar6 = Emb_ObjFanout(pEVar5,0);
      iVar3 = Emb_ObjIsNode(pEVar6);
      if (iVar3 == 0) {
        Dist = Dist + -1;
      }
      else {
        uVar1 = Emb_ManComputeDistance_old(p,pEVar5);
        printf("%d ",(ulong)uVar1);
      }
    }
  }
  Abc_Print(1,"%s =","Time");
  aVar7 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar4) * 1.0) / 1000000.0);
  aVar4 = Abc_Clock();
  printf("From outputs: ");
  for (Dist = 0; Dist < 0x14; Dist = Dist + 1) {
    uVar1 = Gia_ManRandom(0);
    uVar2 = Emb_ManCoNum(p);
    pEVar5 = Emb_ManCo(p,uVar1 % uVar2);
    pEVar6 = Emb_ObjFanin(pEVar5,0);
    iVar3 = Emb_ObjIsNode(pEVar6);
    if (iVar3 == 0) {
      Dist = Dist + -1;
    }
    else {
      uVar1 = Emb_ManComputeDistance_old(p,pEVar5);
      printf("%d ",(ulong)uVar1);
    }
  }
  Abc_Print(1,"%s =","Time");
  aVar7 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar4) * 1.0) / 1000000.0);
  aVar4 = Abc_Clock();
  printf("From nodes: ");
  for (Dist = 0; Dist < 0x14; Dist = Dist + 1) {
    uVar1 = Gia_ManRandom(0);
    uVar2 = Gia_ManObjNum(p->pGia);
    pGVar8 = Gia_ManObj(p->pGia,uVar1 % uVar2);
    if (pGVar8->Value == 0xffffffff) {
      Dist = Dist + -1;
    }
    else {
      pGVar8 = Gia_ManObj(p->pGia,uVar1 % uVar2);
      pEVar5 = Emb_ManObj(p,pGVar8->Value);
      iVar3 = Emb_ObjIsNode(pEVar5);
      if (iVar3 == 0) {
        Dist = Dist + -1;
      }
      else {
        uVar1 = Emb_ManComputeDistance_old(p,pEVar5);
        printf("%d ",(ulong)uVar1);
      }
    }
  }
  Abc_Print(1,"%s =","Time");
  aVar7 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar4) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Gia_ManTestDistanceInternal( Emb_Man_t * p )
{
    int nAttempts = 20;
    int i, iNode, Dist;
    abctime clk;
    Emb_Obj_t * pPivot, * pNext;
    Gia_ManRandom( 1 );
    Emb_ManResetTravId( p );
    // compute distances from several randomly selected PIs
    clk = Abc_Clock();
    printf( "From inputs: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Emb_ManCiNum(p);
        pPivot = Emb_ManCi( p, iNode );
        if ( Emb_ObjFanoutNum(pPivot) == 0 )
            { i--; continue; }
        pNext = Emb_ObjFanout( pPivot, 0 );
        if ( !Emb_ObjIsNode(pNext) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    // compute distances from several randomly selected POs
    clk = Abc_Clock();
    printf( "From outputs: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Emb_ManCoNum(p);
        pPivot = Emb_ManCo( p, iNode );
        pNext = Emb_ObjFanin( pPivot, 0 );
        if ( !Emb_ObjIsNode(pNext) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    // compute distances from several randomly selected nodes
    clk = Abc_Clock();
    printf( "From nodes: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Gia_ManObjNum(p->pGia);
        if ( !~Gia_ManObj(p->pGia, iNode)->Value )
            { i--; continue; }
        pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        if ( !Emb_ObjIsNode(pPivot) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
}